

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void icu_63::ICU_Utility::appendToRule
               (UnicodeString *rule,UChar32 c,UBool isLiteral,UBool escapeUnprintable,
               UnicodeString *quoteBuf)

{
  short sVar1;
  ushort uVar2;
  UBool UVar3;
  uint uVar4;
  int iVar5;
  UnicodeString *pUVar6;
  uint uVar7;
  int32_t srcLength;
  int iVar8;
  undefined7 in_register_00000009;
  char16_t *pcVar9;
  char16_t *pcVar10;
  UChar local_44 [4];
  undefined4 local_3c;
  UChar local_36 [3];
  
  if ((isLiteral == '\0') && (c - 0x20U < 0x5f || escapeUnprintable == '\0')) {
    sVar1 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (quoteBuf->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    if ((iVar5 != 0) || ((c != 0x5c && (c != 0x27)))) {
      if ((0 < iVar5) ||
         (((0x19 < c - 0x61U && 0x19 < c - 0x41U) && (9 < c - 0x30U && 0xffffffa1 < c - 0x7fU) ||
          (UVar3 = PatternProps::isWhiteSpace(c), UVar3 != '\0')))) {
        UnicodeString::append(quoteBuf,c);
        if (c != 0x27) {
          return;
        }
        c = 0x27;
        rule = quoteBuf;
      }
      UnicodeString::append(rule,c);
      return;
    }
    local_36[2] = 0x5c;
    UnicodeString::doAppend(rule,local_36 + 2,0,1);
  }
  else {
    sVar1 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
    local_3c = (undefined4)CONCAT71(in_register_00000009,escapeUnprintable);
    if (sVar1 < 0) {
      iVar5 = (quoteBuf->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    if (0 < iVar5) {
      sVar1 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
      uVar4 = (uint)sVar1;
      if (sVar1 < 0) {
        iVar5 = (quoteBuf->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)uVar4 >> 5;
      }
      if (1 < iVar5) {
        pcVar10 = (quoteBuf->fUnion).fStackFields.fBuffer;
        do {
          pcVar9 = pcVar10;
          if ((uVar4 & 2) == 0) {
            pcVar9 = (quoteBuf->fUnion).fFields.fArray;
          }
          if (*pcVar9 != L'\'') break;
          pcVar9 = pcVar10;
          if ((uVar4 & 2) == 0) {
            pcVar9 = (quoteBuf->fUnion).fFields.fArray;
          }
          if (pcVar9[1] != L'\'') break;
          local_44[0] = L'\\';
          pUVar6 = UnicodeString::doAppend(rule,local_44,0,1);
          local_44[1] = 0x27;
          UnicodeString::doAppend(pUVar6,local_44 + 1,0,1);
          UnicodeString::doReplace(quoteBuf,0,2,(UChar *)0x0,0,0);
          sVar1 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
          uVar4 = (uint)sVar1;
          if (sVar1 < 0) {
            iVar5 = (quoteBuf->fUnion).fFields.fLength;
          }
          else {
            iVar5 = (int)uVar4 >> 5;
          }
        } while (1 < iVar5);
      }
      sVar1 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
      uVar4 = (uint)sVar1;
      if (sVar1 < 0) {
        uVar7 = (quoteBuf->fUnion).fFields.fLength;
      }
      else {
        uVar7 = (int)uVar4 >> 5;
      }
      iVar5 = 0;
      if (1 < (int)uVar7) {
        pcVar10 = (char16_t *)((long)&quoteBuf->fUnion + 2);
        iVar5 = 0;
        do {
          pcVar9 = pcVar10;
          if ((uVar4 & 2) == 0) {
            pcVar9 = (quoteBuf->fUnion).fFields.fArray;
          }
          if (pcVar9[(long)(int)uVar7 + -2] != L'\'') break;
          pcVar9 = pcVar10;
          if ((uVar4 & 2) == 0) {
            pcVar9 = (quoteBuf->fUnion).fFields.fArray;
          }
          if (pcVar9[(ulong)uVar7 - 1] != L'\'') break;
          iVar8 = uVar7 - 2;
          if (((uVar4 & 1) == 0) || (iVar8 != 0)) {
            if ((int)uVar7 < 0x402) {
              (quoteBuf->fUnion).fStackFields.fLengthAndFlags =
                   (short)iVar8 * 0x20 | (ushort)uVar4 & 0x1f;
            }
            else {
              (quoteBuf->fUnion).fStackFields.fLengthAndFlags = (ushort)uVar4 | 0xffe0;
              (quoteBuf->fUnion).fFields.fLength = iVar8;
            }
          }
          else {
            UnicodeString::unBogus(quoteBuf);
          }
          sVar1 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
          uVar4 = (uint)sVar1;
          if (sVar1 < 0) {
            uVar7 = (quoteBuf->fUnion).fFields.fLength;
          }
          else {
            uVar7 = (int)uVar4 >> 5;
          }
          iVar5 = iVar5 + 1;
        } while (1 < (int)uVar7);
      }
      if (0 < (int)uVar7) {
        local_36[0] = L'\'';
        UnicodeString::doAppend(rule,local_36,0,1);
        sVar1 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          srcLength = (quoteBuf->fUnion).fFields.fLength;
        }
        else {
          srcLength = (int)sVar1 >> 5;
        }
        UnicodeString::doAppend(rule,quoteBuf,0,srcLength);
        local_36[1] = 0x27;
        UnicodeString::doAppend(rule,local_36 + 1,0,1);
        uVar2 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
        if ((uVar2 & 1) == 0) {
          if ((short)uVar2 < 0) {
            iVar8 = (quoteBuf->fUnion).fFields.fLength;
          }
          else {
            iVar8 = (int)(short)uVar2 >> 5;
          }
          if (iVar8 != 0) {
            (quoteBuf->fUnion).fStackFields.fLengthAndFlags = uVar2 & 0x1e;
          }
        }
        else {
          UnicodeString::unBogus(quoteBuf);
        }
      }
      if (0 < iVar5) {
        iVar5 = iVar5 + 1;
        do {
          local_44[2] = 0x5c;
          pUVar6 = UnicodeString::doAppend(rule,local_44 + 2,0,1);
          local_44[3] = 0x27;
          UnicodeString::doAppend(pUVar6,local_44 + 3,0,1);
          iVar5 = iVar5 + -1;
        } while (1 < iVar5);
      }
    }
    if (c == -1) {
      return;
    }
    if (c == 0x20) {
      sVar1 = (rule->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar4 = (rule->fUnion).fFields.fLength;
      }
      else {
        uVar4 = (int)sVar1 >> 5;
      }
      if ((int)uVar4 < 1) {
        return;
      }
      if (((int)sVar1 & 2U) == 0) {
        pcVar10 = (rule->fUnion).fFields.fArray;
      }
      else {
        pcVar10 = (char16_t *)((long)&rule->fUnion + 2);
      }
      if (pcVar10[(ulong)uVar4 - 1] == L' ') {
        return;
      }
      c = 0x20;
    }
    else if (((char)local_3c != '\0') &&
            (UVar3 = ICU_Utility::escapeUnprintable(rule,c), UVar3 != '\0')) {
      return;
    }
  }
  UnicodeString::append(rule,c);
  return;
}

Assistant:

void ICU_Utility::appendToRule(UnicodeString& rule,
                               UChar32 c,
                               UBool isLiteral,
                               UBool escapeUnprintable,
                               UnicodeString& quoteBuf) {
    // If we are escaping unprintables, then escape them outside
    // quotes.  \u and \U are not recognized within quotes.  The same
    // logic applies to literals, but literals are never escaped.
    if (isLiteral ||
        (escapeUnprintable && ICU_Utility::isUnprintable(c))) {
        if (quoteBuf.length() > 0) {
            // We prefer backslash APOSTROPHE to double APOSTROPHE
            // (more readable, less similar to ") so if there are
            // double APOSTROPHEs at the ends, we pull them outside
            // of the quote.

            // If the first thing in the quoteBuf is APOSTROPHE
            // (doubled) then pull it out.
            while (quoteBuf.length() >= 2 &&
                   quoteBuf.charAt(0) == APOSTROPHE &&
                   quoteBuf.charAt(1) == APOSTROPHE) {
                rule.append(BACKSLASH).append(APOSTROPHE);
                quoteBuf.remove(0, 2);
            }
            // If the last thing in the quoteBuf is APOSTROPHE
            // (doubled) then remove and count it and add it after.
            int32_t trailingCount = 0;
            while (quoteBuf.length() >= 2 &&
                   quoteBuf.charAt(quoteBuf.length()-2) == APOSTROPHE &&
                   quoteBuf.charAt(quoteBuf.length()-1) == APOSTROPHE) {
                quoteBuf.truncate(quoteBuf.length()-2);
                ++trailingCount;
            }
            if (quoteBuf.length() > 0) {
                rule.append(APOSTROPHE);
                rule.append(quoteBuf);
                rule.append(APOSTROPHE);
                quoteBuf.truncate(0);
            }
            while (trailingCount-- > 0) {
                rule.append(BACKSLASH).append(APOSTROPHE);
            }
        }
        if (c != (UChar32)-1) {
            /* Since spaces are ignored during parsing, they are
             * emitted only for readability.  We emit one here
             * only if there isn't already one at the end of the
             * rule.
             */
            if (c == SPACE) {
                int32_t len = rule.length();
                if (len > 0 && rule.charAt(len-1) != c) {
                    rule.append(c);
                }
            } else if (!escapeUnprintable || !ICU_Utility::escapeUnprintable(rule, c)) {
                rule.append(c);
            }
        }
    }

    // Escape ' and '\' and don't begin a quote just for them
    else if (quoteBuf.length() == 0 &&
             (c == APOSTROPHE || c == BACKSLASH)) {
        rule.append(BACKSLASH);
        rule.append(c);
    }

    // Specials (printable ascii that isn't [0-9a-zA-Z]) and
    // whitespace need quoting.  Also append stuff to quotes if we are
    // building up a quoted substring already.
    else if (quoteBuf.length() > 0 ||
             (c >= 0x0021 && c <= 0x007E &&
              !((c >= 0x0030/*'0'*/ && c <= 0x0039/*'9'*/) ||
                (c >= 0x0041/*'A'*/ && c <= 0x005A/*'Z'*/) ||
                (c >= 0x0061/*'a'*/ && c <= 0x007A/*'z'*/))) ||
             PatternProps::isWhiteSpace(c)) {
        quoteBuf.append(c);
        // Double ' within a quote
        if (c == APOSTROPHE) {
            quoteBuf.append(c);
        }
    }
    
    // Otherwise just append
    else {
        rule.append(c);
    }
}